

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int glslang::TIntermediate::getBaseAlignment
              (TType *type,int *size,int *stride,TLayoutPacking layoutPacking,bool rowMajor)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  int *piVar6;
  ulong uVar7;
  bool bVar8;
  byte local_1c1;
  int local_1a4;
  undefined1 local_1a0 [8];
  TType derefType_1;
  int scalarAlign;
  int memberAlignment;
  TLayoutMatrix subMatrixLayout;
  int memberSize;
  size_t m;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvStack_e8;
  int maxAlignment;
  TTypeList *memberList;
  undefined1 local_d8 [4];
  int arraySize;
  TType derefType;
  int dummyStride;
  bool std140;
  int alignment;
  bool rowMajor_local;
  int *piStack_28;
  TLayoutPacking layoutPacking_local;
  int *stride_local;
  int *size_local;
  TType *type_local;
  
  bVar8 = layoutPacking == ElpStd140;
  *stride = 0;
  std140 = rowMajor;
  alignment = layoutPacking;
  piStack_28 = stride;
  stride_local = size;
  size_local = (int *)type;
  uVar1 = (*type->_vptr_TType[0x1d])();
  if ((uVar1 & 1) == 0) {
    iVar2 = (**(code **)(*(long *)size_local + 0x38))();
    if ((iVar2 == 0xf) || (iVar2 = (**(code **)(*(long *)size_local + 0x38))(), iVar2 == 0x10)) {
      pvStack_e8 = &TType::getStruct((TType *)size_local)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      *stride_local = 0;
      m._4_4_ = 0;
      if (bVar8) {
        m._4_4_ = 0x10;
      }
      for (_subMatrixLayout = 0; uVar7 = _subMatrixLayout,
          sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                            (pvStack_e8), uVar7 < sVar4; _subMatrixLayout = _subMatrixLayout + 1) {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](pvStack_e8,_subMatrixLayout);
        iVar2 = (*pvVar5->type->_vptr_TType[10])();
        uVar1 = (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 8) >> 0x3d);
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](pvStack_e8,_subMatrixLayout);
        if (uVar1 == 0) {
          local_1c1 = std140;
        }
        else {
          local_1c1 = uVar1 == 1;
        }
        derefType_1.spirvType._4_4_ =
             getBaseAlignment(pvVar5->type,&memberAlignment,(int *)((long)&derefType.spirvType + 4),
                              alignment,(bool)(local_1c1 & 1));
        piVar6 = std::max<int>((int *)((long)&m + 4),(int *)((long)&derefType_1.spirvType + 4));
        m._4_4_ = *piVar6;
        RoundToPow2<int>(stride_local,derefType_1.spirvType._4_4_);
        *stride_local = memberAlignment + *stride_local;
      }
      RoundToPow2<int>(stride_local,m._4_4_);
      type_local._4_4_ = m._4_4_;
    }
    else {
      uVar7 = (**(code **)(*(long *)size_local + 0xc0))();
      if ((uVar7 & 1) == 0) {
        uVar7 = (**(code **)(*(long *)size_local + 0xd8))();
        if ((uVar7 & 1) == 0) {
          uVar7 = (**(code **)(*(long *)size_local + 0xe0))();
          if ((uVar7 & 1) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/linkValidate.cpp"
                          ,0x931,
                          "static int glslang::TIntermediate::getBaseAlignment(const TType &, int &, int &, TLayoutPacking, bool)"
                         );
          }
          TType::TType((TType *)local_1a0,(TType *)size_local,0,(bool)(std140 & 1));
          dummyStride = getBaseAlignment((TType *)local_1a0,stride_local,
                                         (int *)((long)&derefType.spirvType + 4),alignment,
                                         (bool)(std140 & 1));
          if (bVar8) {
            piVar6 = std::max<int>(&baseAlignmentVec4Std140,&dummyStride);
            dummyStride = *piVar6;
          }
          RoundToPow2<int>(stride_local,dummyStride);
          *piStack_28 = *stride_local;
          if ((std140 & 1U) == 0) {
            iVar2 = *piStack_28;
            iVar3 = (**(code **)(*(long *)size_local + 0x68))();
            *stride_local = iVar2 * iVar3;
          }
          else {
            iVar2 = *piStack_28;
            iVar3 = (**(code **)(*(long *)size_local + 0x70))();
            *stride_local = iVar2 * iVar3;
          }
          type_local._4_4_ = dummyStride;
          TType::~TType((TType *)local_1a0);
        }
        else {
          derefType_1.spirvType._0_4_ = getBaseAlignmentScalar((TType *)size_local,stride_local);
          iVar2 = (**(code **)(*(long *)size_local + 0x60))();
          if (iVar2 == 1) {
            type_local._4_4_ = (int)derefType_1.spirvType;
          }
          else if (iVar2 == 2) {
            *stride_local = *stride_local << 1;
            type_local._4_4_ = (int)derefType_1.spirvType << 1;
          }
          else {
            iVar2 = (**(code **)(*(long *)size_local + 0x60))();
            *stride_local = iVar2 * *stride_local;
            type_local._4_4_ = (int)derefType_1.spirvType << 2;
          }
        }
      }
      else {
        type_local._4_4_ = getBaseAlignmentScalar((TType *)size_local,stride_local);
      }
    }
  }
  else {
    TType::TType((TType *)local_d8,(TType *)size_local,0,false);
    dummyStride = getBaseAlignment((TType *)local_d8,stride_local,
                                   (int *)((long)&derefType.spirvType + 4),alignment,
                                   (bool)(std140 & 1));
    if (bVar8) {
      piVar6 = std::max<int>(&baseAlignmentVec4Std140,&dummyStride);
      dummyStride = *piVar6;
    }
    RoundToPow2<int>(stride_local,dummyStride);
    *piStack_28 = *stride_local;
    uVar7 = (**(code **)(*(long *)size_local + 0xf8))();
    if (((uVar7 & 1) == 0) || (iVar2 = (**(code **)(*(long *)size_local + 0x78))(), iVar2 != 0)) {
      local_1a4 = (**(code **)(*(long *)size_local + 0x78))();
    }
    else {
      local_1a4 = 1;
    }
    memberList._4_4_ = local_1a4;
    *stride_local = *piStack_28 * local_1a4;
    type_local._4_4_ = dummyStride;
    TType::~TType((TType *)local_d8);
  }
  return type_local._4_4_;
}

Assistant:

int TIntermediate::getBaseAlignment(const TType& type, int& size, int& stride, TLayoutPacking layoutPacking, bool rowMajor)
{
    int alignment;

    bool std140 = layoutPacking == glslang::ElpStd140;
    // When using the std140 storage layout, structures will be laid out in buffer
    // storage with its members stored in monotonically increasing order based on their
    // location in the declaration. A structure and each structure member have a base
    // offset and a base alignment, from which an aligned offset is computed by rounding
    // the base offset up to a multiple of the base alignment. The base offset of the first
    // member of a structure is taken from the aligned offset of the structure itself. The
    // base offset of all other structure members is derived by taking the offset of the
    // last basic machine unit consumed by the previous member and adding one. Each
    // structure member is stored in memory at its aligned offset. The members of a top-
    // level uniform block are laid out in buffer storage by treating the uniform block as
    // a structure with a base offset of zero.
    //
    //   1. If the member is a scalar consuming N basic machine units, the base alignment is N.
    //
    //   2. If the member is a two- or four-component vector with components consuming N basic
    //      machine units, the base alignment is 2N or 4N, respectively.
    //
    //   3. If the member is a three-component vector with components consuming N
    //      basic machine units, the base alignment is 4N.
    //
    //   4. If the member is an array of scalars or vectors, the base alignment and array
    //      stride are set to match the base alignment of a single array element, according
    //      to rules (1), (2), and (3), and rounded up to the base alignment of a vec4. The
    //      array may have padding at the end; the base offset of the member following
    //      the array is rounded up to the next multiple of the base alignment.
    //
    //   5. If the member is a column-major matrix with C columns and R rows, the
    //      matrix is stored identically to an array of C column vectors with R
    //      components each, according to rule (4).
    //
    //   6. If the member is an array of S column-major matrices with C columns and
    //      R rows, the matrix is stored identically to a row of S X C column vectors
    //      with R components each, according to rule (4).
    //
    //   7. If the member is a row-major matrix with C columns and R rows, the matrix
    //      is stored identically to an array of R row vectors with C components each,
    //      according to rule (4).
    //
    //   8. If the member is an array of S row-major matrices with C columns and R
    //      rows, the matrix is stored identically to a row of S X R row vectors with C
    //      components each, according to rule (4).
    //
    //   9. If the member is a structure, the base alignment of the structure is N , where
    //      N is the largest base alignment value of any    of its members, and rounded
    //      up to the base alignment of a vec4. The individual members of this substructure
    //      are then assigned offsets by applying this set of rules recursively,
    //      where the base offset of the first member of the sub-structure is equal to the
    //      aligned offset of the structure. The structure may have padding at the end;
    //      the base offset of the member following the sub-structure is rounded up to
    //      the next multiple of the base alignment of the structure.
    //
    //   10. If the member is an array of S structures, the S elements of the array are laid
    //       out in order, according to rule (9).
    //
    //   Assuming, for rule 10:  The stride is the same as the size of an element.

    stride = 0;
    int dummyStride;

    // rules 4, 6, 8, and 10
    if (type.isArray()) {
        // TODO: perf: this might be flattened by using getCumulativeArraySize(), and a deref that discards all arrayness
        TType derefType(type, 0);
        alignment = getBaseAlignment(derefType, size, dummyStride, layoutPacking, rowMajor);
        if (std140)
            alignment = std::max(baseAlignmentVec4Std140, alignment);
        RoundToPow2(size, alignment);
        stride = size;  // uses full matrix size for stride of an array of matrices (not quite what rule 6/8, but what's expected)
                        // uses the assumption for rule 10 in the comment above
        // use one element to represent the last member of SSBO which is unsized array
        int arraySize = (type.isUnsizedArray() && (type.getOuterArraySize() == 0)) ? 1 : type.getOuterArraySize();
        size = stride * arraySize;
        return alignment;
    }

    // rule 9
    if (type.getBasicType() == EbtStruct || type.getBasicType() == EbtBlock) {
        const TTypeList& memberList = *type.getStruct();

        size = 0;
        int maxAlignment = std140 ? baseAlignmentVec4Std140 : 0;
        for (size_t m = 0; m < memberList.size(); ++m) {
            int memberSize;
            // modify just the children's view of matrix layout, if there is one for this member
            TLayoutMatrix subMatrixLayout = memberList[m].type->getQualifier().layoutMatrix;
            int memberAlignment = getBaseAlignment(*memberList[m].type, memberSize, dummyStride, layoutPacking,
                                                   (subMatrixLayout != ElmNone) ? (subMatrixLayout == ElmRowMajor) : rowMajor);
            maxAlignment = std::max(maxAlignment, memberAlignment);
            RoundToPow2(size, memberAlignment);
            size += memberSize;
        }

        // The structure may have padding at the end; the base offset of
        // the member following the sub-structure is rounded up to the next
        // multiple of the base alignment of the structure.
        RoundToPow2(size, maxAlignment);

        return maxAlignment;
    }

    // rule 1
    if (type.isScalar())
        return getBaseAlignmentScalar(type, size);

    // rules 2 and 3
    if (type.isVector()) {
        int scalarAlign = getBaseAlignmentScalar(type, size);
        switch (type.getVectorSize()) {
        case 1: // HLSL has this, GLSL does not
            return scalarAlign;
        case 2:
            size *= 2;
            return 2 * scalarAlign;
        default:
            size *= type.getVectorSize();
            return 4 * scalarAlign;
        }
    }

    // rules 5 and 7
    if (type.isMatrix()) {
        // rule 5: deref to row, not to column, meaning the size of vector is num columns instead of num rows
        TType derefType(type, 0, rowMajor);

        alignment = getBaseAlignment(derefType, size, dummyStride, layoutPacking, rowMajor);
        if (std140)
            alignment = std::max(baseAlignmentVec4Std140, alignment);
        RoundToPow2(size, alignment);
        stride = size;  // use intra-matrix stride for stride of a just a matrix
        if (rowMajor)
            size = stride * type.getMatrixRows();
        else
            size = stride * type.getMatrixCols();

        return alignment;
    }

    assert(0);  // all cases should be covered above
    size = baseAlignmentVec4Std140;
    return baseAlignmentVec4Std140;
}